

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_div_s_d_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  float64 fVar4;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  pfVar3 = (env->active_fpu).fpr + wt;
  fVar4 = msa_div_s_df(3,pfVar2->fd,pfVar3->fd);
  pfVar1->fd = fVar4;
  fVar4 = msa_div_s_df(3,(&pfVar2->fd)[1],(&pfVar3->fd)[1]);
  (&pfVar1->fd)[1] = fVar4;
  return;
}

Assistant:

void helper_msa_div_s_d(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0]  = msa_div_s_df(DF_DOUBLE, pws->d[0],  pwt->d[0]);
    pwd->d[1]  = msa_div_s_df(DF_DOUBLE, pws->d[1],  pwt->d[1]);
}